

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

ScanResult * __thiscall
wallet::CWallet::ScanForWalletTransactions
          (ScanResult *__return_storage_ptr__,CWallet *this,uint256 *start_block,int start_height,
          optional<int> max_height,WalletRescanReserver *reserver,bool fUpdate,bool save_progress)

{
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  *this_00;
  RecursiveMutex *mutexIn;
  long lVar1;
  map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_> *this_01;
  _Rb_tree_node_base *p_Var2;
  long lVar3;
  double dVar4;
  double dVar5;
  base_blob<256U> *pbVar6;
  unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  uVar7;
  unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  uVar8;
  pointer puVar9;
  bool bVar10;
  int iVar11;
  int32_t iVar12;
  uint uVar13;
  time_point tVar14;
  Chain *pCVar15;
  __uniq_ptr_data<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>,_true,_true>
  this_02;
  CWallet *desc_spkm;
  _Optional_payload_base<int> *p_Var16;
  double dVar17;
  time_point tVar18;
  ScriptPubKeyMan *pSVar19;
  DescriptorScriptPubKeyMan *this_03;
  mapped_type_conflict3 *pmVar20;
  _Rb_tree_node_base *p_Var21;
  WalletDatabase *pWVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  uint256 *puVar24;
  char *pcVar25;
  long lVar26;
  Level level;
  CWallet *this_04;
  size_t posInBlock;
  ulong uVar27;
  pointer __p;
  long in_FS_OFFSET;
  bool bVar28;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  double local_218;
  duration local_1e0;
  WalletBatch local_1c0;
  bool next_block;
  bool block_still_active;
  int block_height;
  double progress_current;
  unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  fast_rescan_filter;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock42;
  undefined8 local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_178;
  undefined8 uStack_158;
  undefined8 local_150;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_148;
  CBlockLocator loc;
  undefined1 local_110;
  undefined1 uStack_10f;
  undefined1 uStack_10e;
  undefined1 uStack_10d;
  undefined1 uStack_10c;
  undefined1 uStack_10b;
  undefined1 uStack_10a;
  undefined1 uStack_109;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  uint256 next_block_hash;
  uint256 end_hash;
  uint256 tip_hash;
  uint256 block_hash;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  local_1e0.__r = (rep)WalletRescanReserver::now(reserver);
  tVar14 = WalletRescanReserver::now(reserver);
  if ((reserver->m_could_reserve != true) ||
     (((reserver->m_wallet->fScanningWallet)._M_base._M_i & 1U) == 0)) {
    __assert_fail("reserver.isReserved()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                  ,0x75a,
                  "CWallet::ScanResult wallet::CWallet::ScanForWalletTransactions(const uint256 &, int, std::optional<int>, const WalletRescanReserver &, bool, const bool)"
                 );
  }
  block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(start_block->super_base_blob<256U>).m_data._M_elems;
  block_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((start_block->super_base_blob<256U>).m_data._M_elems + 8);
  block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((start_block->super_base_blob<256U>).m_data._M_elems + 0x10);
  block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((start_block->super_base_blob<256U>).m_data._M_elems + 0x18);
  (__return_storage_ptr__->last_scanned_height).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  puVar24 = &__return_storage_ptr__->last_failed_block;
  (puVar24->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar24->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar24->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar24->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar24->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar24->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar24->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar24->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar6 = &(__return_storage_ptr__->last_failed_block).super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[8] = '\0';
  (pbVar6->m_data)._M_elems[9] = '\0';
  (pbVar6->m_data)._M_elems[10] = '\0';
  (pbVar6->m_data)._M_elems[0xb] = '\0';
  (pbVar6->m_data)._M_elems[0xc] = '\0';
  (pbVar6->m_data)._M_elems[0xd] = '\0';
  (pbVar6->m_data)._M_elems[0xe] = '\0';
  (pbVar6->m_data)._M_elems[0xf] = '\0';
  pbVar6 = &(__return_storage_ptr__->last_failed_block).super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x10] = '\0';
  (pbVar6->m_data)._M_elems[0x11] = '\0';
  (pbVar6->m_data)._M_elems[0x12] = '\0';
  (pbVar6->m_data)._M_elems[0x13] = '\0';
  (pbVar6->m_data)._M_elems[0x14] = '\0';
  (pbVar6->m_data)._M_elems[0x15] = '\0';
  (pbVar6->m_data)._M_elems[0x16] = '\0';
  (pbVar6->m_data)._M_elems[0x17] = '\0';
  pbVar6 = &(__return_storage_ptr__->last_failed_block).super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x18] = '\0';
  (pbVar6->m_data)._M_elems[0x19] = '\0';
  (pbVar6->m_data)._M_elems[0x1a] = '\0';
  (pbVar6->m_data)._M_elems[0x1b] = '\0';
  (pbVar6->m_data)._M_elems[0x1c] = '\0';
  (pbVar6->m_data)._M_elems[0x1d] = '\0';
  (pbVar6->m_data)._M_elems[0x1e] = '\0';
  (pbVar6->m_data)._M_elems[0x1f] = '\0';
  pbVar6 = &(__return_storage_ptr__->last_scanned_block).super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x1c] = '\0';
  (pbVar6->m_data)._M_elems[0x1d] = '\0';
  (pbVar6->m_data)._M_elems[0x1e] = '\0';
  (pbVar6->m_data)._M_elems[0x1f] = '\0';
  fast_rescan_filter._M_t.
  super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  ._M_t.
  super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
  _M_head_impl = (__uniq_ptr_data<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>,_true,_true>
                  )(__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                    )0x0;
  __return_storage_ptr__->status = SUCCESS;
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[0] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[1] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[2] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pbVar6 = &(__return_storage_ptr__->last_scanned_block).super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[4] = '\0';
  (pbVar6->m_data)._M_elems[5] = '\0';
  (pbVar6->m_data)._M_elems[6] = '\0';
  (pbVar6->m_data)._M_elems[7] = '\0';
  (pbVar6->m_data)._M_elems[8] = '\0';
  (pbVar6->m_data)._M_elems[9] = '\0';
  (pbVar6->m_data)._M_elems[10] = '\0';
  (pbVar6->m_data)._M_elems[0xb] = '\0';
  pbVar6 = &(__return_storage_ptr__->last_scanned_block).super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0xc] = '\0';
  (pbVar6->m_data)._M_elems[0xd] = '\0';
  (pbVar6->m_data)._M_elems[0xe] = '\0';
  (pbVar6->m_data)._M_elems[0xf] = '\0';
  (pbVar6->m_data)._M_elems[0x10] = '\0';
  (pbVar6->m_data)._M_elems[0x11] = '\0';
  (pbVar6->m_data)._M_elems[0x12] = '\0';
  (pbVar6->m_data)._M_elems[0x13] = '\0';
  pbVar6 = &(__return_storage_ptr__->last_scanned_block).super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x14] = '\0';
  (pbVar6->m_data)._M_elems[0x15] = '\0';
  (pbVar6->m_data)._M_elems[0x16] = '\0';
  (pbVar6->m_data)._M_elems[0x17] = '\0';
  (pbVar6->m_data)._M_elems[0x18] = '\0';
  (pbVar6->m_data)._M_elems[0x19] = '\0';
  (pbVar6->m_data)._M_elems[0x1a] = '\0';
  (pbVar6->m_data)._M_elems[0x1b] = '\0';
  if (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) != 0) {
    pCVar15 = chain(this);
    iVar11 = (*pCVar15->_vptr_Chain[8])(pCVar15,0);
    if ((char)iVar11 != '\0') {
      this_02.
      super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      ._M_t.
      super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
      _M_head_impl = (__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                      )operator_new(0x80);
      *(CWallet **)
       this_02.
       super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
       ._M_t.
       super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
       .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
       _M_head_impl = this;
      (((_Rb_tree_header *)
       ((long)this_02.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x10))->_M_header)._M_color = _S_red;
      *(_Base_ptr *)
       ((long)this_02.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x18) = (_Base_ptr)0x0;
      *(_Base_ptr *)
       ((long)this_02.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x20) =
           (_Base_ptr)
           ((long)this_02.
                  super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                  .
                  super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                  ._M_head_impl + 0x10);
      *(_Base_ptr *)
       ((long)this_02.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x28) =
           (_Base_ptr)
           ((long)this_02.
                  super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                  .
                  super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                  ._M_head_impl + 0x10);
      *(size_t *)
       ((long)this_02.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x30) = 0;
      std::
      _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_Hashtable((_Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)((long)this_02.
                             super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                             .
                             super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                             ._M_head_impl + 0x38));
      if ((*(ulong *)(*(long *)this_02.
                               super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                               .
                               super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                               ._M_head_impl + 0xb0) & 0x400000000) == 0) {
        __assert_fail("!m_wallet.IsLegacy()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                      ,0x13d,
                      "wallet::(anonymous namespace)::FastWalletRescanFilter::FastWalletRescanFilter(const CWallet &)"
                     );
      }
      this_04 = *(CWallet **)
                 this_02.
                 super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                 .
                 super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                 ._M_head_impl;
      GetAllScriptPubKeyMans
                ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                  *)&criticalblock42,this_04);
      for (; (bool *)local_180 != &criticalblock42.super_unique_lock._M_owns;
          local_180 = std::_Rb_tree_increment((_Rb_tree_node_base *)local_180)) {
        if (*(long *)(local_180 + 0x20) == 0) {
LAB_009981a8:
          __assert_fail("desc_spkm != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                        ,0x142,
                        "wallet::(anonymous namespace)::FastWalletRescanFilter::FastWalletRescanFilter(const CWallet &)"
                       );
        }
        desc_spkm = (CWallet *)
                    __dynamic_cast(*(long *)(local_180 + 0x20),&ScriptPubKeyMan::typeinfo,
                                   &DescriptorScriptPubKeyMan::typeinfo,0);
        if (desc_spkm == (CWallet *)0x0) goto LAB_009981a8;
        this_04 = desc_spkm;
        anon_unknown_48::FastWalletRescanFilter::AddScriptPubKeys
                  ((FastWalletRescanFilter *)
                   this_02.
                   super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                   .
                   super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                   ._M_head_impl,(DescriptorScriptPubKeyMan *)desc_spkm,0);
        iVar11 = (*(desc_spkm->super_WalletStorage)._vptr_WalletStorage[0xc])(desc_spkm);
        if ((char)iVar11 != '\0') {
          (*(desc_spkm->super_WalletStorage)._vptr_WalletStorage[0x1a])((CWallet *)&loc,desc_spkm);
          iVar12 = DescriptorScriptPubKeyMan::GetEndRange((DescriptorScriptPubKeyMan *)desc_spkm);
          end_hash.super_base_blob<256U>.m_data._M_elems[0] = (char)iVar12;
          end_hash.super_base_blob<256U>.m_data._M_elems[1] = (char)((uint)iVar12 >> 8);
          end_hash.super_base_blob<256U>.m_data._M_elems[2] = (char)((uint)iVar12 >> 0x10);
          end_hash.super_base_blob<256U>.m_data._M_elems[3] = (char)((uint)iVar12 >> 0x18);
          this_04 = (CWallet *)&loc;
          std::
          _Rb_tree<uint256,std::pair<uint256_const,int>,std::_Select1st<std::pair<uint256_const,int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,int>>>
          ::_M_emplace_unique<uint256,int>
                    ((_Rb_tree<uint256,std::pair<uint256_const,int>,std::_Select1st<std::pair<uint256_const,int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,int>>>
                      *)((long)this_02.
                               super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                               .
                               super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                               ._M_head_impl + 8),(uint256 *)&loc,(int *)&end_hash);
        }
      }
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                   *)&criticalblock42);
      uVar7 = fast_rescan_filter;
      tip_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      bVar28 = (__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                )fast_rescan_filter._M_t.
                 super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                 .
                 super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                )0x0;
      fast_rescan_filter._M_t.
      super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      ._M_t.
      super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
      _M_head_impl = (__uniq_ptr_data<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>,_true,_true>
                      )(__uniq_ptr_data<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>,_true,_true>
                        )this_02.
                         super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                         .
                         super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                         ._M_head_impl;
      if (bVar28) {
        std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>::operator()
                  ((default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter> *)
                   uVar7._M_t.
                   super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                   .
                   super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                   ._M_head_impl,(FastWalletRescanFilter *)this_04);
      }
      std::
      unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      ::~unique_ptr((unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                     *)&tip_hash);
    }
  }
  base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock42,(base_blob<256u> *)start_block);
  pcVar25 = "fast variant using block filters";
  if ((__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
       )fast_rescan_filter._M_t.
        super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
        ._M_t.
        super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
        .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
        _M_head_impl ==
      (__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
       )0x0) {
    pcVar25 = "slow variant inspecting all blocks";
  }
  pbVar23 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc;
  loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)pcVar25;
  WalletLogPrintf<std::__cxx11::string,char_const*>
            (this,(ConstevalFormatString<2U>)0xe06a79,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&criticalblock42,
             (char **)pbVar23);
  std::__cxx11::string::~string((string *)&criticalblock42);
  LOCK();
  (this->fAbortRescan)._M_base._M_i = false;
  UNLOCK();
  _((bilingual_str *)&criticalblock42,(ConstevalStringLiteral)0xe06ae3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tip_hash,
                 "%s ",&bStack_178);
  GetDisplayName_abi_cxx11_((string *)&end_hash,this);
  tinyformat::format<std::__cxx11::string>
            ((string *)&loc,(tinyformat *)&tip_hash,(string *)&end_hash,pbVar23);
  this_00 = &this->ShowProgress;
  boost::signals2::
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  ::operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc,0);
  std::__cxx11::string::~string((string *)&loc);
  std::__cxx11::string::~string((string *)&end_hash);
  std::__cxx11::string::~string((string *)&tip_hash);
  bilingual_str::~bilingual_str((bilingual_str *)&criticalblock42);
  mutexIn = &this->cs_wallet;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock42,mutexIn,"cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
             ,0x767,false);
  GetLastBlockHash(&tip_hash,this);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&criticalblock42);
  end_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x10];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x11];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x12];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x13];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x14];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x15];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x16];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x17];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x18];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x19];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
  end_hash.super_base_blob<256U>.m_data._M_elems[0] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0];
  end_hash.super_base_blob<256U>.m_data._M_elems[1] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[1];
  end_hash.super_base_blob<256U>.m_data._M_elems[2] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[2];
  end_hash.super_base_blob<256U>.m_data._M_elems[3] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[3];
  end_hash.super_base_blob<256U>.m_data._M_elems[4] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[4];
  end_hash.super_base_blob<256U>.m_data._M_elems[5] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[5];
  end_hash.super_base_blob<256U>.m_data._M_elems[6] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[6];
  end_hash.super_base_blob<256U>.m_data._M_elems[7] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[7];
  end_hash.super_base_blob<256U>.m_data._M_elems[8] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[8];
  end_hash.super_base_blob<256U>.m_data._M_elems[9] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[9];
  end_hash.super_base_blob<256U>.m_data._M_elems[10] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[10];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xb];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xc];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xd];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xe];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xf];
  if (((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
    pCVar15 = chain(this);
    bStack_178.field_2._8_8_ = (SyncTxState *)0x0;
    uStack_158._0_1_ = '\0';
    uStack_158._1_1_ = '\0';
    uStack_158._2_1_ = '\0';
    uStack_158._3_1_ = '\0';
    uStack_158._4_4_ = 0;
    bStack_178._M_string_length = 0;
    bStack_178.field_2._M_allocated_capacity = 0;
    local_150._0_4_ = 0;
    local_150._4_4_ = 0;
    bStack_178._M_dataplus._M_p = (pointer)0x0;
    criticalblock42.super_unique_lock._M_owns = false;
    criticalblock42.super_unique_lock._9_7_ = 0;
    criticalblock42.super_unique_lock._M_device = (mutex_type *)&end_hash;
    (*pCVar15->_vptr_Chain[0xc])
              (pCVar15,&tip_hash,
               max_height.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>);
  }
  pCVar15 = chain(this);
  (*pCVar15->_vptr_Chain[0x10])(pCVar15,&block_hash);
  dVar4 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  pCVar15 = chain(this);
  (*pCVar15->_vptr_Chain[0x10])(pCVar15);
  local_218 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  puVar24 = &__return_storage_ptr__->last_scanned_block;
  pcVar25 = (char *)puVar24;
  block_height = start_height;
  progress_current = dVar4;
  puVar9 = (pointer)tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
  while( true ) {
    tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = puVar9;
    if (((this->fAbortRescan)._M_base._M_i & 1U) != 0) break;
    p_Var16 = (_Optional_payload_base<int> *)chain(this);
    pcVar25 = *(char **)p_Var16;
    iVar11 = (**(_func_int **)((long)pcVar25 + 0x120))(p_Var16);
    if ((char)iVar11 != '\0') break;
    dVar5 = local_218 - dVar4;
    dVar17 = (progress_current - dVar4) / dVar5;
    if (dVar5 <= 0.0) {
      dVar17 = 0.0;
    }
    LOCK();
    (this->m_scanning_progress).super___atomic_float<double>._M_fp = dVar17;
    UNLOCK();
    pbVar23 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x64;
    if ((0.0 < dVar5) && (block_height % 100 == 0)) {
      _((bilingual_str *)&criticalblock42,(ConstevalStringLiteral)0xe06ae3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &next_block_hash,"%s ",&bStack_178);
      GetDisplayName_abi_cxx11_((string *)&criticalblock43,this);
      tinyformat::format<std::__cxx11::string>
                ((string *)&loc,(tinyformat *)&next_block_hash,(string *)&criticalblock43,pbVar23);
      iVar11 = (int)((this->m_scanning_progress).super___atomic_float<double>._M_fp * 100.0);
      if (0x62 < iVar11) {
        iVar11 = 99;
      }
      if (iVar11 < 2) {
        iVar11 = 1;
      }
      boost::signals2::
      signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
      ::operator()(this_00,(string *)&loc,iVar11);
      std::__cxx11::string::~string((string *)&loc);
      std::__cxx11::string::~string((string *)&criticalblock43);
      std::__cxx11::string::~string((string *)&next_block_hash);
      bilingual_str::~bilingual_str((bilingual_str *)&criticalblock42);
    }
    tVar18 = WalletRescanReserver::now(reserver);
    lVar1 = local_1e0.__r + 60000000000;
    if (lVar1 <= (long)tVar18.__d.__r) {
      local_1e0.__r = (rep)WalletRescanReserver::now(reserver);
      WalletLogPrintf<int,double>
                (this,(ConstevalFormatString<2U>)0xe06af1,&block_height,&progress_current);
    }
    uVar7._M_t.
    super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
    ._M_t.
    super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
    .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
    _M_head_impl = fast_rescan_filter._M_t.
                   super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                   .
                   super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                   ._M_head_impl;
    if ((__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
         )fast_rescan_filter._M_t.
          super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
          .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
          _M_head_impl ==
        (__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
         )0x0) {
      bVar28 = true;
    }
    else {
      this_01 = (map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_>
                 *)((long)fast_rescan_filter._M_t.
                          super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                          .
                          super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                          ._M_head_impl + 8);
      p_Var2 = (_Rb_tree_node_base *)
               ((long)fast_rescan_filter._M_t.
                      super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                      .
                      super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                      ._M_head_impl + 0x10);
      for (p_Var21 = *(_Rb_tree_node_base **)
                      ((long)fast_rescan_filter._M_t.
                             super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                             .
                             super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                             ._M_head_impl + 0x20);
          uVar8._M_t.
          super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
          .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
          _M_head_impl = fast_rescan_filter._M_t.
                         super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                         .
                         super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                         ._M_head_impl, p_Var21 != p_Var2;
          p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21)) {
        pSVar19 = GetScriptPubKeyMan(*(CWallet **)
                                      uVar7._M_t.
                                      super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                                      .
                                      super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                                      ._M_head_impl,(uint256 *)(p_Var21 + 1));
        if (pSVar19 == (ScriptPubKeyMan *)0x0) {
LAB_00998189:
          __assert_fail("desc_spkm != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                        ,0x150,
                        "void wallet::(anonymous namespace)::FastWalletRescanFilter::UpdateIfNeeded()"
                       );
        }
        this_03 = (DescriptorScriptPubKeyMan *)
                  __dynamic_cast(pSVar19,&ScriptPubKeyMan::typeinfo,
                                 &DescriptorScriptPubKeyMan::typeinfo,0);
        if (this_03 == (DescriptorScriptPubKeyMan *)0x0) goto LAB_00998189;
        iVar12 = DescriptorScriptPubKeyMan::GetEndRange(this_03);
        if ((int)p_Var21[2]._M_color < iVar12) {
          anon_unknown_48::FastWalletRescanFilter::AddScriptPubKeys
                    ((FastWalletRescanFilter *)
                     uVar7._M_t.
                     super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                     .
                     super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                     ._M_head_impl,this_03,p_Var21[2]._M_color);
          (*(this_03->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])
                    ((CBlock *)&criticalblock42,this_03);
          pmVar20 = std::
                    map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_>
                    ::at(this_01,(key_type *)&criticalblock42);
          *pmVar20 = iVar12;
        }
      }
      pCVar15 = chain(*(CWallet **)
                       fast_rescan_filter._M_t.
                       super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                       .
                       super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                       ._M_head_impl);
      level = Trace;
      uVar13 = (*pCVar15->_vptr_Chain[9])
                         (pCVar15,0,&block_hash,
                          (long)uVar8._M_t.
                                super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                                .
                                super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                                ._M_head_impl + 0x38);
      bVar28 = true;
      if ((uVar13 >> 8 & 1) == 0) {
        bVar10 = ::LogAcceptCategory((LogFlags)pCVar15,level);
        if (bVar10) {
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)&criticalblock42,(base_blob<256u> *)&block_hash);
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
          ;
          source_file._M_len = 0x61;
          logging_function._M_str = "ScanForWalletTransactions";
          logging_function._M_len = 0x19;
          LogPrintFormatInternal<int,std::__cxx11::string>
                    (logging_function,source_file,0x78b,SCAN,Debug,
                     (ConstevalFormatString<2U>)0xe06b6c,&block_height,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &criticalblock42);
LAB_00997a47:
          std::__cxx11::string::~string((string *)&criticalblock42);
        }
      }
      else if ((uVar13 & 1) == 0) {
        *(undefined8 *)
         ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 0x10)
             = block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
        *(undefined8 *)
         ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 0x18)
             = block_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
        *(undefined8 *)(puVar24->super_base_blob<256U>).m_data._M_elems =
             block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
        *(undefined8 *)
         ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 8) =
             block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
        (__return_storage_ptr__->last_scanned_height).super__Optional_base<int,_true,_true>.
        _M_payload.super__Optional_payload_base<int> =
             (_Optional_payload_base<int>)((ulong)(uint)block_height | 0x100000000);
        bVar28 = false;
      }
      else {
        bVar10 = ::LogAcceptCategory((LogFlags)pCVar15,level);
        if (bVar10) {
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)&criticalblock42,(base_blob<256u> *)&block_hash);
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
          ;
          source_file_00._M_len = 0x61;
          logging_function_00._M_str = "ScanForWalletTransactions";
          logging_function_00._M_len = 0x19;
          LogPrintFormatInternal<int,std::__cxx11::string>
                    (logging_function_00,source_file_00,0x784,SCAN,Debug,
                     (ConstevalFormatString<2U>)0xe06b37,&block_height,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &criticalblock42);
          goto LAB_00997a47;
        }
      }
    }
    block_still_active = false;
    next_block = false;
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    p_Var16 = (_Optional_payload_base<int> *)chain(this);
    bStack_178._M_dataplus._M_p = (pointer)0x0;
    uStack_158._0_1_ = '\0';
    uStack_158._1_1_ = '\0';
    uStack_158._2_1_ = '\0';
    uStack_158._3_1_ = '\0';
    uStack_158._4_4_ = 0;
    local_150._0_4_ = 0;
    local_150._4_4_ = 0;
    bStack_178.field_2._M_allocated_capacity = 0;
    criticalblock42.super_unique_lock._M_device = (mutex_type *)0x0;
    criticalblock42.super_unique_lock._M_owns = false;
    criticalblock42.super_unique_lock._9_7_ = 0;
    bStack_178._M_string_length = (size_type)&block_still_active;
    _local_110 = (pointer)0x0;
    loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start = &next_block_hash;
    pcVar25 = *(char **)p_Var16;
    bStack_178.field_2._8_8_ = (SyncTxState *)&loc;
    (**(_func_int **)((long)pcVar25 + 0x50))(p_Var16,&block_hash,(CBlock *)&criticalblock42);
    if (bVar28) {
      CBlock::CBlock((CBlock *)&criticalblock42);
      p_Var16 = (_Optional_payload_base<int> *)chain(this);
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _local_110 = (pointer)0x0;
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pcVar25 = *(char **)p_Var16;
      (**(_func_int **)((long)pcVar25 + 0x50))(p_Var16,&block_hash,(SyncTxState *)&loc);
      if ((uint32_t)local_150 == 0) {
        *(undefined8 *)
         ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 0x10)
             = block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
        *(undefined8 *)
         ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 0x18)
             = block_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
        *(undefined8 *)
         (__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems =
             block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
        *(undefined8 *)
         ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 8) =
             block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
        __return_storage_ptr__->status = FAILURE;
LAB_00997e07:
        iVar11 = 0;
      }
      else {
        pcVar25 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
        ;
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  (&criticalblock43,mutexIn,"cs_wallet",
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                   ,0x79c,false);
        bVar28 = block_still_active;
        if (block_still_active == true) {
          lVar26 = 0;
          for (uVar27 = 0;
              uVar27 < (ulong)((long)local_148.
                                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_148.
                                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4);
              uVar27 = uVar27 + 1) {
            loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
            loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
            loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
            local_110 = block_hash.super_base_blob<256U>.m_data._M_elems[0x18];
            uStack_10f = block_hash.super_base_blob<256U>.m_data._M_elems[0x19];
            uStack_10e = block_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
            uStack_10d = block_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
            uStack_10c = block_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
            uStack_10b = block_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
            uStack_10a = block_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
            uStack_109 = block_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
            SyncTransaction(this,(CTransactionRef *)
                                 ((long)&((local_148.
                                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + lVar26),(SyncTxState *)&loc,fUpdate,true);
            lVar26 = lVar26 + 0x10;
          }
          *(undefined4 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
           0x10) = block_hash.super_base_blob<256U>.m_data._M_elems._16_4_;
          *(undefined4 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
           0x14) = block_hash.super_base_blob<256U>.m_data._M_elems._20_4_;
          *(undefined4 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
           0x18) = block_hash.super_base_blob<256U>.m_data._M_elems._24_4_;
          *(undefined4 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
           0x1c) = block_hash.super_base_blob<256U>.m_data._M_elems._28_4_;
          *(undefined4 *)(puVar24->super_base_blob<256U>).m_data._M_elems =
               block_hash.super_base_blob<256U>.m_data._M_elems._0_4_;
          *(undefined4 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 4)
               = block_hash.super_base_blob<256U>.m_data._M_elems._4_4_;
          *(undefined4 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 8)
               = block_hash.super_base_blob<256U>.m_data._M_elems._8_4_;
          *(undefined4 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 0xc
           ) = block_hash.super_base_blob<256U>.m_data._M_elems._12_4_;
          pcVar25 = (char *)((ulong)(uint)block_height | 0x100000000);
          (__return_storage_ptr__->last_scanned_height).super__Optional_base<int,_true,_true>.
          _M_payload.super__Optional_payload_base<int> = (_Optional_payload_base<int>)pcVar25;
          iVar11 = 0;
          if (save_progress && lVar1 <= (long)tVar18.__d.__r) {
            (*this->m_chain->_vptr_Chain[6])((SyncTxState *)&loc,this->m_chain,&block_hash);
            if (loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start !=
                loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              WalletLogPrintf<int>(this,(ConstevalFormatString<1U>)0xe06bb3,&block_height);
              pWVar22 = GetDatabase(this);
              (*pWVar22->_vptr_WalletDatabase[0xe])(&local_1c0,pWVar22,1);
              local_1c0.m_database = pWVar22;
              WalletBatch::WriteBestBlock(&local_1c0,&loc);
              if (local_1c0.m_batch._M_t.
                  super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                  .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                   )0x0) {
                (*(*(_func_int ***)
                    local_1c0.m_batch._M_t.
                    super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                    .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
              }
            }
            std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                      ((_Vector_base<uint256,_std::allocator<uint256>_> *)&loc);
          }
        }
        else {
          *(undefined8 *)
           ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 0x10
           ) = block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 0x18
           ) = block_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
          *(undefined8 *)
           (__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems =
               block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 8) =
               block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
          __return_storage_ptr__->status = FAILURE;
          iVar11 = 3;
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock);
        if (bVar28 != false) goto LAB_00997e07;
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(&local_148);
      if (iVar11 != 0) break;
    }
    bVar28 = ((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int> & 0x100000000) == 0;
    pcVar25._0_1_ = bVar28;
    if ((max_height.super__Optional_base<int,_true,_true>._M_payload.
         super__Optional_payload_base<int>._M_payload <= block_height && !bVar28) ||
       (next_block != true)) break;
    block_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x10];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x11];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x12];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x13];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x14];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x15];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x16];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x17];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x18];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x19];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
    block_hash.super_base_blob<256U>.m_data._M_elems[0] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0];
    block_hash.super_base_blob<256U>.m_data._M_elems[1] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[1];
    block_hash.super_base_blob<256U>.m_data._M_elems[2] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[2];
    block_hash.super_base_blob<256U>.m_data._M_elems[3] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[3];
    block_hash.super_base_blob<256U>.m_data._M_elems[4] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[4];
    block_hash.super_base_blob<256U>.m_data._M_elems[5] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[5];
    block_hash.super_base_blob<256U>.m_data._M_elems[6] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[6];
    block_hash.super_base_blob<256U>.m_data._M_elems[7] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[7];
    block_hash.super_base_blob<256U>.m_data._M_elems[8] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[8];
    block_hash.super_base_blob<256U>.m_data._M_elems[9] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[9];
    block_hash.super_base_blob<256U>.m_data._M_elems[10] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[10];
    block_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0xb];
    block_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0xc];
    block_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0xd];
    block_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0xe];
    block_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0xf];
    block_height = block_height + 1;
    pCVar15 = chain(this);
    (*pCVar15->_vptr_Chain[0x10])(pCVar15,&block_hash);
    progress_current = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    criticalblock42.super_unique_lock._M_device =
         (mutex_type *)tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
    criticalblock42.super_unique_lock._M_owns =
         (bool)tip_hash.super_base_blob<256U>.m_data._M_elems[8];
    criticalblock42.super_unique_lock._9_1_ = tip_hash.super_base_blob<256U>.m_data._M_elems[9];
    criticalblock42.super_unique_lock._10_1_ = tip_hash.super_base_blob<256U>.m_data._M_elems[10];
    criticalblock42.super_unique_lock._11_1_ = tip_hash.super_base_blob<256U>.m_data._M_elems[0xb];
    criticalblock42.super_unique_lock._12_1_ = tip_hash.super_base_blob<256U>.m_data._M_elems[0xc];
    criticalblock42.super_unique_lock._13_1_ = tip_hash.super_base_blob<256U>.m_data._M_elems[0xd];
    criticalblock42.super_unique_lock._14_1_ = tip_hash.super_base_blob<256U>.m_data._M_elems[0xe];
    criticalblock42.super_unique_lock._15_1_ = tip_hash.super_base_blob<256U>.m_data._M_elems[0xf];
    pcVar25 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
    ;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock43,mutexIn,"cs_wallet",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
               ,0x7cb,false);
    GetLastBlockHash((uint256 *)&loc,this);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock);
    tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_start;
    tip_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_finish;
    tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    tip_hash.super_base_blob<256U>.m_data._M_elems[0x18] = local_110;
    tip_hash.super_base_blob<256U>.m_data._M_elems[0x19] = uStack_10f;
    tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = uStack_10e;
    tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = uStack_10d;
    tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = uStack_10c;
    tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = uStack_10b;
    tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = uStack_10a;
    tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = uStack_109;
    puVar9 = (pointer)_local_110;
    if (((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> & 0x100000000) == 0) {
      bVar28 = ::operator!=((base_blob<256U> *)&criticalblock42,&tip_hash.super_base_blob<256U>);
      puVar9 = (pointer)tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
      if (bVar28) {
        p_Var16 = (_Optional_payload_base<int> *)chain(this);
        pcVar25 = *(char **)p_Var16;
        (**(_func_int **)((long)pcVar25 + 0x80))(p_Var16);
        local_218 = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
        puVar9 = (pointer)tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
      }
    }
  }
  if (((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> & 0x100000000) == 0) {
    WalletLogPrintf<>(this,(ConstevalFormatString<0U>)0xe06bcd);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock42,mutexIn,"cs_wallet",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
               ,0x7d4,false);
    p_Var16 = (_Optional_payload_base<int> *)chain(this);
    pcVar25 = *(char **)p_Var16;
    (**(_func_int **)((long)pcVar25 + 0x1a0))(p_Var16,&this->super_Notifications);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock42.super_unique_lock);
  }
  _((bilingual_str *)&criticalblock42,(ConstevalStringLiteral)0xe06ae3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &next_block_hash,"%s ",&bStack_178);
  GetDisplayName_abi_cxx11_((string *)&criticalblock43,this);
  tinyformat::format<std::__cxx11::string>
            ((string *)&loc,(tinyformat *)&next_block_hash,(string *)&criticalblock43,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar25);
  boost::signals2::
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  ::operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc,100
              );
  std::__cxx11::string::~string((string *)&loc);
  std::__cxx11::string::~string((string *)&criticalblock43);
  std::__cxx11::string::~string((string *)&next_block_hash);
  bilingual_str::~bilingual_str((bilingual_str *)&criticalblock42);
  if (block_height != 0) {
    if (((this->fAbortRescan)._M_base._M_i & 1U) != 0) {
      WalletLogPrintf<int,double>
                (this,(ConstevalFormatString<2U>)0xe06bf5,&block_height,&progress_current);
LAB_0099810e:
      __return_storage_ptr__->status = USER_ABORT;
      goto LAB_0099814e;
    }
    if (block_height != 0) {
      pCVar15 = chain(this);
      iVar11 = (*pCVar15->_vptr_Chain[0x24])(pCVar15);
      if ((char)iVar11 != '\0') {
        WalletLogPrintf<int,double>
                  (this,(ConstevalFormatString<2U>)0xe06c1e,&block_height,&progress_current);
        goto LAB_0099810e;
      }
    }
  }
  tVar18 = WalletRescanReserver::now(reserver);
  criticalblock42.super_unique_lock._M_device =
       (mutex_type *)(((long)tVar18.__d.__r - (long)tVar14.__d.__r) / 1000000);
  WalletLogPrintf<long>(this,(ConstevalFormatString<1U>)0xe06c5f,(long *)&criticalblock42);
LAB_0099814e:
  std::
  unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  ::~unique_ptr(&fast_rescan_filter);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CWallet::ScanResult CWallet::ScanForWalletTransactions(const uint256& start_block, int start_height, std::optional<int> max_height, const WalletRescanReserver& reserver, bool fUpdate, const bool save_progress)
{
    constexpr auto INTERVAL_TIME{60s};
    auto current_time{reserver.now()};
    auto start_time{reserver.now()};

    assert(reserver.isReserved());

    uint256 block_hash = start_block;
    ScanResult result;

    std::unique_ptr<FastWalletRescanFilter> fast_rescan_filter;
    if (!IsLegacy() && chain().hasBlockFilterIndex(BlockFilterType::BASIC)) fast_rescan_filter = std::make_unique<FastWalletRescanFilter>(*this);

    WalletLogPrintf("Rescan started from block %s... (%s)\n", start_block.ToString(),
                    fast_rescan_filter ? "fast variant using block filters" : "slow variant inspecting all blocks");

    fAbortRescan = false;
    ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), 0); // show rescan progress in GUI as dialog or on splashscreen, if rescan required on startup (e.g. due to corruption)
    uint256 tip_hash = WITH_LOCK(cs_wallet, return GetLastBlockHash());
    uint256 end_hash = tip_hash;
    if (max_height) chain().findAncestorByHeight(tip_hash, *max_height, FoundBlock().hash(end_hash));
    double progress_begin = chain().guessVerificationProgress(block_hash);
    double progress_end = chain().guessVerificationProgress(end_hash);
    double progress_current = progress_begin;
    int block_height = start_height;
    while (!fAbortRescan && !chain().shutdownRequested()) {
        if (progress_end - progress_begin > 0.0) {
            m_scanning_progress = (progress_current - progress_begin) / (progress_end - progress_begin);
        } else { // avoid divide-by-zero for single block scan range (i.e. start and stop hashes are equal)
            m_scanning_progress = 0;
        }
        if (block_height % 100 == 0 && progress_end - progress_begin > 0.0) {
            ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), std::max(1, std::min(99, (int)(m_scanning_progress * 100))));
        }

        bool next_interval = reserver.now() >= current_time + INTERVAL_TIME;
        if (next_interval) {
            current_time = reserver.now();
            WalletLogPrintf("Still rescanning. At block %d. Progress=%f\n", block_height, progress_current);
        }

        bool fetch_block{true};
        if (fast_rescan_filter) {
            fast_rescan_filter->UpdateIfNeeded();
            auto matches_block{fast_rescan_filter->MatchesBlock(block_hash)};
            if (matches_block.has_value()) {
                if (*matches_block) {
                    LogDebug(BCLog::SCAN, "Fast rescan: inspect block %d [%s] (filter matched)\n", block_height, block_hash.ToString());
                } else {
                    result.last_scanned_block = block_hash;
                    result.last_scanned_height = block_height;
                    fetch_block = false;
                }
            } else {
                LogDebug(BCLog::SCAN, "Fast rescan: inspect block %d [%s] (WARNING: block filter not found!)\n", block_height, block_hash.ToString());
            }
        }

        // Find next block separately from reading data above, because reading
        // is slow and there might be a reorg while it is read.
        bool block_still_active = false;
        bool next_block = false;
        uint256 next_block_hash;
        chain().findBlock(block_hash, FoundBlock().inActiveChain(block_still_active).nextBlock(FoundBlock().inActiveChain(next_block).hash(next_block_hash)));

        if (fetch_block) {
            // Read block data
            CBlock block;
            chain().findBlock(block_hash, FoundBlock().data(block));

            if (!block.IsNull()) {
                LOCK(cs_wallet);
                if (!block_still_active) {
                    // Abort scan if current block is no longer active, to prevent
                    // marking transactions as coming from the wrong block.
                    result.last_failed_block = block_hash;
                    result.status = ScanResult::FAILURE;
                    break;
                }
                for (size_t posInBlock = 0; posInBlock < block.vtx.size(); ++posInBlock) {
                    SyncTransaction(block.vtx[posInBlock], TxStateConfirmed{block_hash, block_height, static_cast<int>(posInBlock)}, fUpdate, /*rescanning_old_block=*/true);
                }
                // scan succeeded, record block as most recent successfully scanned
                result.last_scanned_block = block_hash;
                result.last_scanned_height = block_height;

                if (save_progress && next_interval) {
                    CBlockLocator loc = m_chain->getActiveChainLocator(block_hash);

                    if (!loc.IsNull()) {
                        WalletLogPrintf("Saving scan progress %d.\n", block_height);
                        WalletBatch batch(GetDatabase());
                        batch.WriteBestBlock(loc);
                    }
                }
            } else {
                // could not scan block, keep scanning but record this block as the most recent failure
                result.last_failed_block = block_hash;
                result.status = ScanResult::FAILURE;
            }
        }
        if (max_height && block_height >= *max_height) {
            break;
        }
        {
            if (!next_block) {
                // break successfully when rescan has reached the tip, or
                // previous block is no longer on the chain due to a reorg
                break;
            }

            // increment block and verification progress
            block_hash = next_block_hash;
            ++block_height;
            progress_current = chain().guessVerificationProgress(block_hash);

            // handle updated tip hash
            const uint256 prev_tip_hash = tip_hash;
            tip_hash = WITH_LOCK(cs_wallet, return GetLastBlockHash());
            if (!max_height && prev_tip_hash != tip_hash) {
                // in case the tip has changed, update progress max
                progress_end = chain().guessVerificationProgress(tip_hash);
            }
        }
    }
    if (!max_height) {
        WalletLogPrintf("Scanning current mempool transactions.\n");
        WITH_LOCK(cs_wallet, chain().requestMempoolTransactions(*this));
    }
    ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), 100); // hide progress dialog in GUI
    if (block_height && fAbortRescan) {
        WalletLogPrintf("Rescan aborted at block %d. Progress=%f\n", block_height, progress_current);
        result.status = ScanResult::USER_ABORT;
    } else if (block_height && chain().shutdownRequested()) {
        WalletLogPrintf("Rescan interrupted by shutdown request at block %d. Progress=%f\n", block_height, progress_current);
        result.status = ScanResult::USER_ABORT;
    } else {
        WalletLogPrintf("Rescan completed in %15dms\n", Ticks<std::chrono::milliseconds>(reserver.now() - start_time));
    }
    return result;
}